

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

SubDFriendlyKnotType
ON_SubD::NurbsKnotType(int order,int cv_count,double *knots,ON_SimpleArray<double> *triple_knots)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  SubDFriendlyKnotType local_57;
  SubDFriendlyKnotType local_55;
  bool local_54;
  double d;
  int knot_dex;
  bool bPiecewiseUniform;
  bool bUnclamped;
  bool bClamped;
  bool bClamped1;
  bool bClamped0;
  double deltatol;
  double delta;
  ON_SimpleArray<double> *triple_knots_local;
  double *knots_local;
  int cv_count_local;
  int order_local;
  
  if (triple_knots != (ON_SimpleArray<double> *)0x0) {
    ON_SimpleArray<double>::SetCount(triple_knots,0);
  }
  if ((((order == 4) && (3 < cv_count)) && (knots != (double *)0x0)) &&
     (dVar3 = knots[3] - knots[2], 0.0 < dVar3)) {
    dVar4 = dVar3 * 1.490116119385e-08;
    bVar1 = false;
    if ((*knots == knots[1]) && (!NAN(*knots) && !NAN(knots[1]))) {
      bVar1 = knots[1] == knots[2];
    }
    bVar2 = false;
    if ((knots[cv_count + -1] == knots[cv_count]) &&
       (!NAN(knots[cv_count + -1]) && !NAN(knots[cv_count]))) {
      bVar2 = knots[cv_count] == knots[cv_count + 1];
    }
    if ((bVar1) && (triple_knots != (ON_SimpleArray<double> *)0x0)) {
      ON_SimpleArray<double>::Append(triple_knots,knots + 2);
    }
    bVar6 = false;
    if (bVar1) {
      bVar6 = bVar2;
    }
    local_54 = false;
    if ((((bVar6 == false) && (local_54 = false, ABS((knots[1] - *knots) - dVar3) <= dVar4)) &&
        (local_54 = false, ABS((knots[2] - knots[1]) - dVar3) <= dVar4)) &&
       (local_54 = false, ABS((knots[cv_count] - knots[cv_count + -1]) - dVar3) <= dVar4)) {
      local_54 = ABS((knots[cv_count + 1] - knots[cv_count]) - dVar3) <= dVar4;
    }
    if (bVar6 != local_54) {
      bVar1 = false;
      d._4_4_ = 3;
      do {
        if (cv_count + -1 <= d._4_4_) {
          if ((bVar2 != false) && (triple_knots != (ON_SimpleArray<double> *)0x0)) {
            ON_SimpleArray<double>::Append(triple_knots,knots + (cv_count + -1));
          }
          if (bVar6 == false) {
            local_57 = UnclampedUniform;
          }
          else {
            local_55 = ClampedPiecewiseUniform;
            if (!bVar1) {
              local_55 = ClampedUniform;
            }
            local_57 = local_55;
          }
          return local_57;
        }
        dVar5 = knots[d._4_4_ + 1] - knots[d._4_4_];
        if ((dVar5 != 0.0) || (NAN(dVar5))) {
          if (dVar4 < ABS(dVar5 - dVar3)) {
            return Unfriendly;
          }
        }
        else {
          if (((bVar6 == false) || (knots[d._4_4_ + 2] != knots[d._4_4_])) ||
             (NAN(knots[d._4_4_ + 2]) || NAN(knots[d._4_4_]))) {
            return Unfriendly;
          }
          bVar1 = true;
          d._4_4_ = d._4_4_ + 1;
          if ((bVar2) && (triple_knots != (ON_SimpleArray<double> *)0x0)) {
            ON_SimpleArray<double>::Append(triple_knots,knots + d._4_4_);
          }
        }
        d._4_4_ = d._4_4_ + 1;
      } while( true );
    }
  }
  return Unfriendly;
}

Assistant:

ON_SubD::SubDFriendlyKnotType ON_SubD::NurbsKnotType(
    int order,
    int cv_count,
    const double* knots,
    ON_SimpleArray<double>* triple_knots
  )
{
  if (nullptr != triple_knots)
    triple_knots->SetCount(0);
  for (;;)
  {
    if (4 != order || cv_count < order || nullptr == knots)
      break;

    const double delta = knots[3] - knots[2];
    if (false == (delta > 0.0))
      break;

    const double deltatol = ON_SQRT_EPSILON * delta;

    const bool bClamped0 = knots[0] == knots[1] && knots[1] == knots[2];
    const bool bClamped1 = knots[cv_count - 1] == knots[cv_count] && knots[cv_count] == knots[cv_count + 1];
    if (bClamped0 && nullptr != triple_knots)
      triple_knots->Append(knots[2]);

    const bool bClamped = bClamped0 && bClamped1;
    const bool bUnclamped =
      (false == bClamped)
      && fabs(knots[1] - knots[0] - delta) <= deltatol
      && fabs(knots[2] - knots[1] - delta) <= deltatol
      && fabs(knots[cv_count] - knots[cv_count - 1] - delta) <= deltatol
      && fabs(knots[cv_count + 1] - knots[cv_count] - delta) <= deltatol
      ;
    if ( bClamped == bUnclamped)
      break;

    bool bPiecewiseUniform = false;
    for (int knot_dex = 3; knot_dex < cv_count - 1; ++knot_dex)
    {
      const double d = knots[knot_dex + 1] - knots[knot_dex];
      if (0.0 == d)
      {
        if (bClamped && knots[knot_dex + 2] == knots[knot_dex])
        {
          bPiecewiseUniform = true;
          ++knot_dex;
          if (bClamped1 && nullptr != triple_knots)
            triple_knots->Append(knots[knot_dex]);
          continue;
        }
      }
      else
      {
        if (fabs(d - delta) <= deltatol)
          continue;
      }
      return ON_SubD::SubDFriendlyKnotType::Unfriendly;
    }

    if (bClamped1 && nullptr != triple_knots)
      triple_knots->Append(knots[cv_count - 1]);

    return
      bClamped
      ? (bPiecewiseUniform ? ON_SubD::SubDFriendlyKnotType::ClampedPiecewiseUniform : ON_SubD::SubDFriendlyKnotType::ClampedUniform)
      : ON_SubD::SubDFriendlyKnotType::UnclampedUniform;
  }

  return ON_SubD::SubDFriendlyKnotType::Unfriendly;
}